

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O1

int channel_mix_2_0_to_5_0(mixed_segment *segment)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 *puVar5;
  ulong uVar6;
  float fVar7;
  float fVar8;
  uint32_t frames;
  float *ce;
  float *rr;
  float *rl;
  float *fr;
  float *fl;
  float *r;
  float *l;
  uint32_t local_4c;
  float *local_48;
  float *local_40;
  float *local_38;
  float *local_30;
  float *local_28;
  float *local_20;
  float *local_18;
  
  puVar5 = (undefined8 *)segment->data;
  local_4c = 0xffffffff;
  mixed_buffer_request_read(&local_18,&local_4c,(mixed_buffer *)*puVar5);
  mixed_buffer_request_read(&local_20,&local_4c,(mixed_buffer *)puVar5[1]);
  mixed_buffer_request_write(&local_28,&local_4c,(mixed_buffer *)puVar5[0xe]);
  mixed_buffer_request_write(&local_30,&local_4c,(mixed_buffer *)puVar5[0xf]);
  mixed_buffer_request_write(&local_38,&local_4c,(mixed_buffer *)puVar5[0x10]);
  mixed_buffer_request_write(&local_40,&local_4c,(mixed_buffer *)puVar5[0x11]);
  mixed_buffer_request_write(&local_48,&local_4c,(mixed_buffer *)puVar5[0x12]);
  if ((ulong)local_4c != 0) {
    uVar6 = 0;
    do {
      fVar1 = local_18[uVar6];
      fVar2 = local_20[uVar6];
      fVar7 = (fVar1 + fVar2) * 0.5;
      fVar3 = *(float *)((long)puVar5 + 0xe4);
      fVar4 = *(float *)((long)puVar5 + 0xec);
      fVar8 = ((*(float *)((long)puVar5 + 0x104) * *(float *)(puVar5 + 0x1d) +
               *(float *)((long)puVar5 + 0xfc) * fVar7 + *(float *)(puVar5 + 0x20) * fVar3) -
              *(float *)((long)puVar5 + 0xf4) * fVar4) -
              *(float *)(puVar5 + 0x1f) * *(float *)(puVar5 + 0x1e);
      *(float *)((long)puVar5 + 0xe4) = fVar7;
      *(float *)(puVar5 + 0x1d) = fVar3;
      *(float *)((long)puVar5 + 0xec) = fVar8;
      *(float *)(puVar5 + 0x1e) = fVar4;
      local_28[uVar6] = fVar1;
      local_30[uVar6] = fVar2;
      local_38[uVar6] = (fVar7 * -0.5 + fVar1 + fVar1) * 0.571;
      local_40[uVar6] = (fVar7 * -0.5 + fVar2 + fVar2) * 0.571;
      local_48[uVar6] = fVar8;
      uVar6 = uVar6 + 1;
    } while (local_4c != uVar6);
  }
  mixed_buffer_finish_read(local_4c,(mixed_buffer *)*puVar5);
  mixed_buffer_finish_read(local_4c,(mixed_buffer *)puVar5[1]);
  mixed_buffer_finish_write(local_4c,(mixed_buffer *)puVar5[0xe]);
  mixed_buffer_finish_write(local_4c,(mixed_buffer *)puVar5[0xf]);
  mixed_buffer_finish_write(local_4c,(mixed_buffer *)puVar5[0x10]);
  mixed_buffer_finish_write(local_4c,(mixed_buffer *)puVar5[0x11]);
  mixed_buffer_finish_write(local_4c,(mixed_buffer *)puVar5[0x12]);
  return 1;
}

Assistant:

VECTORIZE int channel_mix_2_0_to_5_0(struct mixed_segment *segment){
  struct channel_data *data = (struct channel_data *)segment->data;

  uint32_t frames = UINT32_MAX;
  float *restrict l, *restrict r, *restrict fl, *restrict fr, *restrict rl, *restrict rr, *restrict ce;
  mixed_buffer_request_read(&l, &frames, data->in[MIXED_LEFT]);
  mixed_buffer_request_read(&r, &frames, data->in[MIXED_RIGHT]);
  mixed_buffer_request_write(&fl, &frames, data->out[MIXED_LEFT_FRONT]);
  mixed_buffer_request_write(&fr, &frames, data->out[MIXED_RIGHT_FRONT]);
  mixed_buffer_request_write(&rl, &frames, data->out[MIXED_LEFT_REAR]);
  mixed_buffer_request_write(&rr, &frames, data->out[MIXED_RIGHT_REAR]);
  mixed_buffer_request_write(&ce, &frames, data->out[MIXED_CENTER]);
  for(uint32_t i=0; i<frames; ++i){
    float li = l[i];
    float ri = r[i];

    float c = (li+ri)*0.5f;
    float ci = biquad_sample(c, &data->lp[0]);
    float rli = 0.571f * (li + (li - 0.5f * c));
    float rri = 0.571f * (ri + (ri - 0.5f * c));

    fl[i] = li;
    fr[i] = ri;
    rl[i] = rli;
    rr[i] = rri;
    ce[i] = ci;
  }
  mixed_buffer_finish_read(frames, data->in[MIXED_LEFT]);
  mixed_buffer_finish_read(frames, data->in[MIXED_RIGHT]);
  mixed_buffer_finish_write(frames, data->out[MIXED_LEFT_FRONT]);
  mixed_buffer_finish_write(frames, data->out[MIXED_RIGHT_FRONT]);
  mixed_buffer_finish_write(frames, data->out[MIXED_LEFT_REAR]);
  mixed_buffer_finish_write(frames, data->out[MIXED_RIGHT_REAR]);
  mixed_buffer_finish_write(frames, data->out[MIXED_CENTER]);
  return 1;
}